

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void __thiscall tinygltf::PositionalEmitter::PositionalEmitter(PositionalEmitter *this)

{
  _Rb_tree_header *p_Var1;
  
  this->coneInnerAngle = 6.283185307179586;
  this->coneOuterAngle = 6.283185307179586;
  *(undefined4 *)&this->coneOuterGain = 0;
  *(undefined4 *)((long)&this->coneOuterGain + 4) = 0;
  *(undefined4 *)&this->maxDistance = 0;
  *(undefined4 *)((long)&this->maxDistance + 4) = 0x40590000;
  this->refDistance = 1.0;
  this->rolloffFactor = 1.0;
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->extensions)._M_t._M_impl.super__Rb_tree_header;
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->extensions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Value::Value(&this->extras);
  (this->extras_json_string)._M_dataplus._M_p = (pointer)&(this->extras_json_string).field_2;
  (this->extras_json_string)._M_string_length = 0;
  (this->extras_json_string).field_2._M_local_buf[0] = '\0';
  (this->extensions_json_string)._M_dataplus._M_p = (pointer)&(this->extensions_json_string).field_2
  ;
  (this->extensions_json_string)._M_string_length = 0;
  (this->extensions_json_string).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

PositionalEmitter() = default;